

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O2

int search(ion_bpp_handle_t handle,ion_bpp_buffer_t *buf,void *key,ion_bpp_external_address_t rec,
          ion_bpp_key_t **mkey,ion_bpp_mode_e mode)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ion_bpp_node_t *piVar6;
  ion_bpp_key_t *piVar7;
  int iVar8;
  ulong uStack_70;
  
  iVar8 = (*(ushort *)buf->p >> 1) - 1;
  iVar4 = 0;
  bVar1 = false;
  uStack_70 = rec;
LAB_00109707:
  do {
    iVar3 = (iVar8 + iVar4) / 2;
    do {
      if (iVar8 < iVar4) {
        piVar6 = buf->p;
        if (*(ushort *)piVar6 < 2) {
          *mkey = &piVar6->fkey;
          return -1;
        }
        if ((bVar1 && mode == MODE_FIRST) && *(int *)((long)handle + 0xc) != 0) {
          *mkey = *mkey + *(int *)((long)handle + 0xbc);
          return 0;
        }
        if (mode == MODE_FGEQ) {
          iVar8 = *(int *)((long)handle + 0xbc);
          *mkey = &piVar6->fkey + (long)iVar8 * (long)iVar4;
          cVar2 = (**(code **)((long)handle + 0x18))
                            (key,&piVar6->fkey + (long)iVar8 * (long)iVar4,
                             *(undefined4 *)((long)handle + 8));
          piVar6 = buf->p;
          if (((int)((*(ushort *)piVar6 >> 1) - 1) <= iVar4) || (-1 < cVar2)) goto LAB_00109918;
          lVar5 = (long)*(int *)((long)handle + 0xbc) * ((long)iVar4 + 1);
        }
        else {
          if (mode != MODE_LLEQ) {
            return (int)uStack_70;
          }
          iVar4 = *(int *)((long)handle + 0xbc);
          *mkey = &piVar6->fkey + (long)iVar4 * ((long)iVar8 + 1);
          cVar2 = (**(code **)((long)handle + 0x18))
                            (key,&piVar6->fkey + (long)iVar4 * ((long)iVar8 + 1),
                             *(undefined4 *)((long)handle + 8));
          piVar6 = buf->p;
          if ((iVar8 != (*(ushort *)piVar6 >> 1) - 1) && ((iVar8 == -1 || ('\0' < cVar2))))
          goto LAB_00109918;
          lVar5 = (long)*(int *)((long)handle + 0xbc) * (long)iVar8;
        }
        *mkey = &piVar6->fkey + lVar5;
        cVar2 = (**(code **)((long)handle + 0x18))
                          (key,&piVar6->fkey + lVar5,*(undefined4 *)((long)handle + 8));
LAB_00109918:
        return (int)cVar2;
      }
      piVar7 = &buf->p->fkey + (long)*(int *)((long)handle + 0xbc) * (long)iVar3;
      *mkey = piVar7;
      cVar2 = (**(code **)((long)handle + 0x18))(key,piVar7,*(undefined4 *)((long)handle + 8));
      if ((cVar2 < '\0') || (mode == MODE_FGEQ && cVar2 == '\0')) {
        uStack_70 = (ulong)(uint)(int)cVar2;
LAB_001097d1:
        iVar8 = iVar3 + -1;
        goto LAB_00109707;
      }
      if ((mode == MODE_LLEQ) || (cVar2 != '\0')) {
        uStack_70 = (ulong)(uint)(int)cVar2;
LAB_001097a9:
        iVar4 = iVar3 + 1;
        goto LAB_00109707;
      }
      if (*(int *)((long)handle + 0xc) == 0) {
        return 0;
      }
      if (mode == MODE_MATCH) {
        uStack_70 = 0xffffffffffffffff;
        if (rec < *(long *)(*mkey + *(int *)((long)handle + 8))) goto LAB_001097d1;
        uStack_70 = 1;
        if (rec <= *(long *)(*mkey + *(int *)((long)handle + 8))) {
          return 0;
        }
        goto LAB_001097a9;
      }
      uStack_70 = 0;
    } while (mode != MODE_FIRST);
    if (iVar3 <= iVar4) {
      return 0;
    }
    iVar8 = iVar3 + -1;
    uStack_70 = 0;
    bVar1 = true;
  } while( true );
}

Assistant:

static int
search(
	ion_bpp_handle_t			handle,
	ion_bpp_buffer_t			*buf,
	void						*key,
	ion_bpp_external_address_t	rec,
	ion_bpp_key_t				**mkey,
	ion_bpp_mode_e				mode
) {
	/*
	 * input:
	 *   p					  pointer to node
	 *   key					key to find
	 *   rec					record address (dupkey only)
	 * output:
	 *   k					  pointer to ion_bpp_key_t info
	 * returns:
	 *   CC_EQ				  key = mkey
	 *   CC_LT				  key < mkey
	 *   CC_GT				  key > mkey
	*/
	ion_bpp_h_node_t	*h = handle;
	int					cc;		/* condition code */
	int					m;		/* midpoint of search */
	int					lb;		/* lower-bound of binary search */
	int					ub;		/* upper-bound of binary search */
	ion_bpp_bool_t		foundDup;			/* true if found a duplicate key */

	/* scan current node for key using binary search */
	foundDup	= boolean_false;
	lb			= 0;
	ub			= ct(buf) - 1;

	while (lb <= ub) {
		m		= (lb + ub) / 2;
		*mkey	= fkey(buf) + ks(m);
		cc		= h->comp(key, key(*mkey), (ion_key_size_t) (h->keySize));

		if ((cc < 0) || ((cc == 0) && (MODE_FGEQ == mode))) {
			/* key less than key[m] */
			ub = m - 1;
		}
		else if ((cc > 0) || ((cc == 0) && (MODE_LLEQ == mode))) {
			/* key greater than key[m] */
			lb = m + 1;
		}
		else {
			/* keys match */
			if (h->dupKeys) {
				switch (mode) {
					case MODE_FIRST:
						/* backtrack to first key */
						ub = m - 1;

						if (lb > ub) {
							return ION_CC_EQ;
						}

						foundDup = boolean_true;
						break;

					case MODE_MATCH:

						/* rec's must also match */
						if (rec < rec(*mkey)) {
							ub	= m - 1;
							cc	= ION_CC_LT;
						}
						else if (rec > rec(*mkey)) {
							lb	= m + 1;
							cc	= ION_CC_GT;
						}
						else {
							return ION_CC_EQ;
						}

						break;

					case MODE_FGEQ:
					case MODE_LLEQ:	/* nop */
						break;
				}
			}
			else {
				return cc;
			}
		}
	}

	if (ct(buf) == 0) {
		/* empty list */
		*mkey = fkey(buf);
		return ION_CC_LT;
	}

	if (h->dupKeys && (mode == MODE_FIRST) && foundDup) {
		/* next key is first key in set of duplicates */
		*mkey += ks(1);
		return ION_CC_EQ;
	}

	if (MODE_LLEQ == mode) {
		*mkey	= fkey(buf) + ks(ub + 1);
		cc		= h->comp(key, key(*mkey), (ion_key_size_t) (h->keySize));

		if ((ub == ct(buf) - 1) || ((ub != -1) && (cc <= 0))) {
			*mkey	= fkey(buf) + ks(ub);
			cc		= h->comp(key, key(*mkey), (ion_key_size_t) (h->keySize));
		}

		return cc;
	}

	if (MODE_FGEQ == mode) {
		*mkey	= fkey(buf) + ks(lb);
		cc		= h->comp(key, key(*mkey), (ion_key_size_t) (h->keySize));

		if ((lb < ct(buf) - 1) && (cc < 0)) {
			*mkey	= fkey(buf) + ks(lb + 1);
			cc		= h->comp(key, key(*mkey), (ion_key_size_t) (h->keySize));
		}

		return cc;
	}

	/* didn't find key */
	return cc;
}